

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodeCustomLinSolver.cpp
# Opt level: O0

int pele::physics::reactions::cvode::SUNLinSolSolve_Sparse_custom
              (SUNLinearSolver S,SUNMatrix a_A,N_Vector x,N_Vector b,Real param_5)

{
  long *in_RDI;
  Real *b_d_offset;
  Real *x_d_offset;
  Real *Data_offset;
  int offset_RHS;
  int offset;
  int tid;
  Real *Data;
  Real *b_d;
  Real *x_d;
  SUNMatrix in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 local_64;
  
  N_VGetArrayPointer((N_Vector)0x1f5e0b);
  N_VGetArrayPointer((N_Vector)0x1f5e1a);
  SUNSparseMatrix_Data(in_stack_ffffffffffffff78);
  for (local_64 = 0; local_64 < *(int *)(*in_RDI + 8); local_64 = local_64 + 1) {
    amrex::Abort_host((char *)CONCAT44(local_64 * *(int *)(*in_RDI + 0xc),in_stack_ffffffffffffff90)
                     );
  }
  return 0;
}

Assistant:

int
SUNLinSolSolve_Sparse_custom(
  SUNLinearSolver S, SUNMatrix a_A, N_Vector x, N_Vector b, amrex::Real /*tol*/)
{
  BL_PROFILE("Pele::GaussSolver()");
  amrex::Real* x_d = N_VGetArrayPointer(x);
  amrex::Real* b_d = N_VGetArrayPointer(b);

  auto* Data = static_cast<amrex::Real*>(SUNSparseMatrix_Data(a_A));

  for (int tid = 0; tid < SUN_CUSP_NUM_SUBSYS(S); tid++) {
    int offset = tid * SUN_CUSP_SUBSYS_NNZ(S);
    int offset_RHS = tid * SUN_CUSP_SUBSYS_SIZE(S);
    amrex::Real* Data_offset = Data + offset;
    amrex::Real* x_d_offset = x_d + offset_RHS;
    amrex::Real* b_d_offset = b_d + offset_RHS;
    sgjsolve(Data_offset, x_d_offset, b_d_offset);
  }

  return (SUNLS_SUCCESS);
}